

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfFunction.h
# Opt level: O2

void __thiscall
halfFunction<Imath_3_2::half>::halfFunction<Imf_3_4::roundNBit>
          (halfFunction<Imath_3_2::half> *this,roundNBit f,half domainMin,half domainMax,
          half defaultValue,half posInfValue,half negInfValue,half nanValue)

{
  float *pfVar1;
  float fVar2;
  half hVar3;
  half *phVar4;
  half hVar5;
  int i;
  ulong uVar6;
  ulong uVar7;
  roundNBit local_44;
  ulong local_40;
  halfFunction<Imath_3_2::half> *local_38;
  
  local_44.n = f.n;
  phVar4 = (half *)operator_new__(0x20000);
  this->_lut = phVar4;
  uVar7 = (ulong)domainMin._h;
  local_40 = uVar7;
  local_38 = this;
  for (uVar6 = 0; uVar6 != 0x10000; uVar6 = uVar6 + 1) {
    hVar3._h = (uint16_t)uVar6;
    if ((uVar6 & 0x3ff) == 0 || (~(uint)uVar6 & 0x7c00) != 0) {
      if ((hVar3._h & 0x7fff) == 0x7c00) {
        hVar5._h = posInfValue._h;
        if ((short)hVar3._h < 0) {
          hVar5._h = negInfValue._h;
        }
        phVar4[uVar6]._h = hVar5._h;
      }
      else {
        fVar2 = *(float *)(_imath_half_to_float_table + uVar6 * 4);
        if ((fVar2 < *(float *)(_imath_half_to_float_table + uVar7 * 4)) ||
           (pfVar1 = (float *)(_imath_half_to_float_table + (ulong)domainMax._h * 4),
           *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          phVar4[uVar6]._h = defaultValue._h;
        }
        else {
          hVar3 = Imf_3_4::roundNBit::operator()(&local_44,hVar3);
          phVar4 = local_38->_lut;
          phVar4[uVar6]._h = hVar3._h;
          uVar7 = local_40;
        }
      }
    }
    else {
      phVar4[uVar6]._h = nanValue._h;
    }
  }
  return;
}

Assistant:

halfFunction<T>::halfFunction (
    Function f,
    half     domainMin,
    half     domainMax,
    T        defaultValue,
    T        posInfValue,
    T        negInfValue,
    T        nanValue)
{
#ifndef IMATH_HAVE_LARGE_STACK
    _lut = new T[1 << 16];
#endif

    for (int i = 0; i < (1 << 16); i++)
    {
        half x;
        x.setBits (i);

        if (x.isNan ())
            _lut[i] = nanValue;
        else if (x.isInfinity ())
            _lut[i] = x.isNegative () ? negInfValue : posInfValue;
        else if (x < domainMin || x > domainMax)
            _lut[i] = defaultValue;
        else
            _lut[i] = f (x);
    }
}